

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_andi_(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  
  uVar1 = ctx->opcode;
  tcg_gen_andi_i64_ppc64
            (ctx->uc->tcg_ctx,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0xd & 0xf8)),
             *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0x12 & 0xf8)),(ulong)(uVar1 & 0xffff));
  uVar1._0_1_ = ctx->sf_mode;
  uVar1._1_1_ = ctx->has_cfar;
  uVar1._2_1_ = ctx->fpu_enabled;
  uVar1._3_1_ = ctx->altivec_enabled;
  gen_set_Rc0((DisasContext_conflict10 *)(ulong)uVar1,(TCGv_i64)ctx->uc->tcg_ctx);
  return;
}

Assistant:

static void gen_andi_(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    tcg_gen_andi_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], cpu_gpr[rS(ctx->opcode)],
                    UIMM(ctx->opcode));
    gen_set_Rc0(ctx, cpu_gpr[rA(ctx->opcode)]);
}